

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * google::protobuf::anon_unknown_24::ValueOutOfRange<int>
                   (string *__return_storage_ptr__,string_view type_name,string_view option_name)

{
  int local_48;
  int local_44;
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)524292,_(absl::lts_20250127::FormatConversionCharSet)524292>
  local_40;
  undefined1 local_30 [8];
  string_view option_name_local;
  string_view type_name_local;
  
  option_name_local._M_len = (size_t)option_name._M_str;
  local_30 = (undefined1  [8])option_name._M_len;
  option_name_local._M_str = (char *)type_name._M_len;
  absl::lts_20250127::str_format_internal::
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)524292,_(absl::lts_20250127::FormatConversionCharSet)524292>
  ::FormatSpecTemplate(&local_40,"Value out of range, %d to %d, for %s option \"%s\".");
  local_44 = std::numeric_limits<int>::min();
  local_48 = std::numeric_limits<int>::max();
  absl::lts_20250127::
  StrFormat<int,_int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            (__return_storage_ptr__,&local_40,&local_44,&local_48,
             (basic_string_view<char,_std::char_traits<char>_> *)&option_name_local._M_str,
             (basic_string_view<char,_std::char_traits<char>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string ValueOutOfRange(absl::string_view type_name,
                            absl::string_view option_name) {
  return absl::StrFormat("Value out of range, %d to %d, for %s option \"%s\".",
                         std::numeric_limits<T>::min(),
                         std::numeric_limits<T>::max(), type_name, option_name);
}